

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O2

int __thiscall
LASreadItemCompressed_POINT10_v2::init(LASreadItemCompressed_POINT10_v2 *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  ArithmeticModel *pAVar2;
  undefined8 uVar3;
  StreamingMedian5 *pSVar4;
  ulong uVar5;
  long lVar6;
  
  pSVar4 = this->last_x_diff_median5;
  for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
    pSVar4->values[4] = 0;
    pSVar4->values[0] = 0;
    pSVar4->values[1] = 0;
    pSVar4->values[2] = 0;
    pSVar4->values[3] = 0;
    pSVar4->high = true;
    pSVar4[0x10].values[0] = 0;
    pSVar4[0x10].values[1] = 0;
    pSVar4[0x10].values[2] = 0;
    pSVar4[0x10].values[3] = 0;
    pSVar4[0x10].values[4] = 0;
    pSVar4[0x10].high = true;
    this->last_intensity[uVar5] = 0;
    this->last_height[uVar5 >> 1 & 0x7fffffff] = 0;
    pSVar4 = pSVar4 + 1;
  }
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_changed_values,(U32 *)0x0);
  IntegerCompressor::initDecompressor(this->ic_intensity);
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_scan_angle_rank[0],(U32 *)0x0);
  ArithmeticDecoder::initSymbolModel(this->dec,this->m_scan_angle_rank[1],(U32 *)0x0);
  IntegerCompressor::initDecompressor(this->ic_point_source_ID);
  for (lVar6 = -0x800; lVar6 != 0; lVar6 = lVar6 + 8) {
    pAVar2 = *(ArithmeticModel **)((long)this->m_classification + lVar6);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::initSymbolModel(this->dec,pAVar2,(U32 *)0x0);
    }
    pAVar2 = *(ArithmeticModel **)((long)this->m_user_data + lVar6);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::initSymbolModel(this->dec,pAVar2,(U32 *)0x0);
    }
    pAVar2 = *(ArithmeticModel **)((long)&this->ic_dx + lVar6);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::initSymbolModel(this->dec,pAVar2,(U32 *)0x0);
    }
  }
  IntegerCompressor::initDecompressor(this->ic_dx);
  IntegerCompressor::initDecompressor(this->ic_dy);
  IntegerCompressor::initDecompressor(this->ic_z);
  uVar3 = *(undefined8 *)(ctx + 8);
  *(undefined8 *)this->last_item = *(undefined8 *)ctx;
  *(undefined8 *)(this->last_item + 8) = uVar3;
  uVar1 = *(undefined4 *)(ctx + 0x10);
  *(undefined4 *)(this->last_item + 0x10) = uVar1;
  this->last_item[0xc] = '\0';
  this->last_item[0xd] = '\0';
  return (int)CONCAT71((uint7)(uint3)((uint)uVar1 >> 8),1);
}

Assistant:

BOOL LASreadItemCompressed_POINT10_v2::init(const U8* item, U32& context)
{
  U32 i;

  /* init state */
  for (i=0; i < 16; i++)
  {
    last_x_diff_median5[i].init();
    last_y_diff_median5[i].init();
    last_intensity[i] = 0;
    last_height[i/2] = 0;
  }

  /* init models and integer compressors */
  dec->initSymbolModel(m_changed_values);
  ic_intensity->initDecompressor();
  dec->initSymbolModel(m_scan_angle_rank[0]);
  dec->initSymbolModel(m_scan_angle_rank[1]);
  ic_point_source_ID->initDecompressor();
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) dec->initSymbolModel(m_bit_byte[i]);
    if (m_classification[i]) dec->initSymbolModel(m_classification[i]);
    if (m_user_data[i]) dec->initSymbolModel(m_user_data[i]);
  }
  ic_dx->initDecompressor();
  ic_dy->initDecompressor();
  ic_z->initDecompressor();

  /* init last item */
  memcpy(last_item, item, 20);

  /* but set intensity to zero */ 
  last_item[12] = 0;
  last_item[13] = 0;

  return TRUE;
}